

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

vec * cyclic_reduction(vec *__return_storage_ptr__,TridiagonalMatrix *m,vec *b)

{
  pointer *ppdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  bool bVar6;
  vec *pvVar7;
  TridiagonalMatrix *pTVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  pointer pdVar12;
  double *pdVar13;
  uint uVar14;
  long lVar15;
  ulong __n;
  long lVar16;
  vec *result;
  vec new_b;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  a_vecs;
  vec new_rhs;
  vec new_c;
  vec new_a;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  rhs_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  c_vecs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  b_vecs;
  allocator_type local_121;
  vec *local_120;
  TridiagonalMatrix *local_118;
  vector<double,_std::allocator<double>_> local_110;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f8;
  void *local_e0 [2];
  long local_d0;
  void *local_c8 [2];
  long local_b8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_98;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_58;
  pointer local_40;
  undefined8 local_38;
  
  local_f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = __return_storage_ptr__;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&local_f8,&m->as);
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&local_58,&m->bs);
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&local_78,&m->cs);
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&local_98,b);
  uVar14 = m->size;
  local_118 = m;
  if ((int)uVar14 < 2) {
    __n = (ulong)uVar14;
  }
  else {
    __n = (ulong)uVar14;
    do {
      __n = __n >> 1;
      local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_b0,__n,(value_type_conflict *)&local_110,(allocator_type *)local_c8);
      local_c8[0] = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_110,__n,(value_type_conflict *)local_c8,(allocator_type *)local_e0);
      local_e0[0] = (void *)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_c8,__n,
                 (value_type_conflict *)local_e0,(allocator_type *)&local_38);
      local_38 = 0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_e0,__n,
                 (value_type_conflict *)&local_38,&local_121);
      if (1 < uVar14) {
        pdVar2 = local_f8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar3 = local_58.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar12 = local_78.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 = local_98.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar16 = 0;
        do {
          *(double *)
           ((long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar16) =
               (*(double *)((long)pdVar2 + lVar16 * 2 + 8) -
               (*(double *)((long)pdVar3 + lVar16 * 2 + 8) * *(double *)((long)pdVar12 + lVar16 * 2)
               ) / *(double *)((long)pdVar2 + lVar16 * 2)) -
               (*(double *)((long)pdVar12 + lVar16 * 2 + 8) *
               *(double *)((long)pdVar3 + lVar16 * 2 + 0x10)) /
               *(double *)((long)pdVar2 + lVar16 * 2 + 0x10);
          *(double *)
           ((long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar16) =
               (-*(double *)((long)pdVar3 + lVar16 * 2) * *(double *)((long)pdVar3 + lVar16 * 2 + 8)
               ) / *(double *)((long)pdVar2 + lVar16 * 2);
          *(double *)((long)local_c8[0] + lVar16) =
               (-*(double *)((long)pdVar12 + lVar16 * 2 + 8) *
               *(double *)((long)pdVar12 + lVar16 * 2 + 0x10)) /
               *(double *)((long)pdVar2 + lVar16 * 2 + 0x10);
          *(double *)((long)local_e0[0] + lVar16) =
               (*(double *)((long)pdVar4 + lVar16 * 2 + 8) -
               (*(double *)((long)pdVar4 + lVar16 * 2) * *(double *)((long)pdVar3 + lVar16 * 2 + 8))
               / *(double *)((long)pdVar2 + lVar16 * 2)) -
               (*(double *)((long)pdVar4 + lVar16 * 2 + 0x10) *
               *(double *)((long)pdVar12 + lVar16 * 2 + 8)) /
               *(double *)((long)pdVar2 + lVar16 * 2 + 0x10);
          lVar16 = lVar16 + 8;
        } while (__n << 3 != lVar16);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_f8,&local_b0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_58,&local_110);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_78,(value_type *)local_c8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_98,(value_type *)local_e0);
      if (local_e0[0] != (void *)0x0) {
        operator_delete(local_e0[0],local_d0 - (long)local_e0[0]);
      }
      if (local_c8[0] != (void *)0x0) {
        operator_delete(local_c8[0],local_b8 - (long)local_c8[0]);
      }
      if (local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_110.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      bVar6 = 3 < uVar14;
      uVar14 = (uint)__n;
    } while (bVar6);
  }
  pTVar8 = local_118;
  local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (local_120,(long)local_118->size + 2,(value_type_conflict *)&local_b0,
             (allocator_type *)&local_110);
  local_40 = local_f8.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)local_f8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_f8.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((int)uVar9 != 0) {
    iVar11 = pTVar8->size / 2 + 1;
    local_118 = (TridiagonalMatrix *)
                local_58.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (local_120->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = uVar9 & 0xffffffff;
    do {
      uVar9 = uVar9 - 1;
      if (0 < (int)__n) {
        pdVar2 = local_98.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar16 = *(long *)((long)local_58.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar9 * 0x18);
        pdVar3 = local_78.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar12 = local_f8.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar9].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar15 = (long)iVar11;
        uVar10 = 1;
        pdVar13 = pdVar5;
        do {
          pdVar13[lVar15] =
               ((pdVar2[uVar10 - 1] - *(double *)(lVar16 + -8 + uVar10 * 8) * *pdVar13) -
               pdVar3[uVar10 - 1] * pdVar13[lVar15 * 2]) / pdVar12[uVar10 - 1];
          pdVar13 = pdVar13 + lVar15 * 2;
          uVar10 = uVar10 + 2;
        } while (uVar10 <= __n);
      }
      __n = (ulong)((int)__n * 2 + 1);
      iVar11 = iVar11 / 2;
    } while (uVar9 != 0);
  }
  pdVar3 = (local_120->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar12 = (local_120->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish + -1;
  (local_120->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = pdVar12;
  pdVar2 = pdVar3 + 1;
  if (pdVar2 != pdVar12) {
    memmove(pdVar3,pdVar2,(long)pdVar12 - (long)pdVar2);
  }
  pvVar7 = local_120;
  ppdVar1 = &(local_120->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppdVar1 = *ppdVar1 + -1;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_58);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_f8);
  return pvVar7;
}

Assistant:

vec cyclic_reduction(const TridiagonalMatrix& m, const vec& b)
{
	std::vector<vec > a_vecs;
	a_vecs.push_back(m.as);
	std::vector<vec > b_vecs;
	b_vecs.push_back(m.bs);
	std::vector<vec > c_vecs;
	c_vecs.push_back(m.cs);
	std::vector<vec > rhs_vecs;
	rhs_vecs.push_back(b);
	int equation_count = m.size;

	while (equation_count > 1)
	{
		equation_count /= 2;
		vec new_a(equation_count, 0.0);
		vec new_b(equation_count, 0.0);
		vec new_c(equation_count, 0.0);
		vec new_rhs(equation_count, 0.0);
		vec& old_a = a_vecs.back();
		vec& old_b = b_vecs.back();
		vec& old_c = c_vecs.back();
		vec& old_rhs = rhs_vecs.back();

		for (int i = 0; i < equation_count; i++)
		{
			int old_i = 2 * i + 1;
			new_a[i] = old_a[old_i] -
				old_b[old_i] * old_c[old_i - 1] / old_a[old_i - 1] -
				old_c[old_i] * old_b[old_i + 1] / old_a[old_i + 1];
			new_b[i] = -old_b[old_i - 1] * old_b[old_i] / old_a[old_i - 1];
			new_c[i] = -old_c[old_i] * old_c[old_i + 1] / old_a[old_i + 1];
			new_rhs[i] = old_rhs[old_i] -
				old_rhs[old_i - 1] * old_b[old_i] / old_a[old_i - 1] -
				old_rhs[old_i + 1] * old_c[old_i] / old_a[old_i + 1];
		}

		a_vecs.push_back(new_a);
		b_vecs.push_back(new_b);
		c_vecs.push_back(new_c);
		rhs_vecs.push_back(new_rhs);
	}

	// result is padded with one zero one both sides to emulate
	// implicit variables x_0 and x_N
	vec result(m.size + 2, 0.0);
	// factor maps indices of equations in full system extended with x_0=0
	// and x_N=0 onto indices of equations in reduced extended system
	int factor = m.size / 2 + 1;
	for (unsigned int i = a_vecs.size(); i-- > 0;)
	{
		vec& as = a_vecs[i];
		vec& bs = b_vecs[i];
		vec& cs = c_vecs[i];
		vec& rhs = rhs_vecs[i];

		// j is an index of an equation in the reduced system extended with
		// x_0=0 and x_N=0
		for (int j = 1; j < equation_count + 1; j += 2)
		{
			// index in coefficents arrays is less by 1 since they don't
			// include x_0=0 and x_N=0 equations
			int coeff_j = j - 1;
			// mapping j to the index in the full extended system
			int result_j = j * factor;
			int result_j_minus1 = result_j - factor;
			int result_j_plus1 = result_j + factor;

			result[result_j] =
				(rhs[coeff_j] - bs[coeff_j] * result[result_j_minus1] -
				cs[coeff_j] * result[result_j_plus1]) / as[coeff_j];
		}

		equation_count = equation_count * 2 + 1;
		factor /= 2;
	}

	// drop the padding
	result.pop_back();
	result.erase(result.begin());

	return result;
}